

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_timeout.cpp
# Opt level: O0

void __thiscall tst_qpromise_timeout::rejectedStdChrono(tst_qpromise_timeout *this)

{
  bool bVar1;
  byte bVar2;
  anon_class_16_2_30a9d772 handler;
  bool local_ee;
  bool local_ed [5];
  QString local_e8;
  QString local_d0;
  QString local_b8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> *local_a0;
  qint64 *local_98;
  QPromiseTimeoutException local_90 [3];
  int local_74;
  duration<long,_std::ratio<1L,_1L>_> local_70;
  QPromiseTimeoutException *local_68;
  anon_class_1_0_00000001 local_59;
  QPromise<int> local_58;
  QPromiseBase<int> local_48;
  undefined1 local_38 [8];
  QPromise<int> p;
  qint64 elapsed;
  QElapsedTimer timer;
  tst_qpromise_timeout *this_local;
  
  timer.t2 = (qint64)this;
  QElapsedTimer::QElapsedTimer((QElapsedTimer *)&elapsed);
  p.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0xffffffffffffffff;
  QElapsedTimer::start();
  QtPromise::QPromise<int>::QPromise<tst_qpromise_timeout::rejectedStdChrono()::__0>
            (&local_58,&local_59);
  local_74 = 2;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1l>> *)&local_70,&local_74);
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<long,std::ratio<1l,1l>,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_68,&local_70);
  local_90[0] = (QPromiseTimeoutException)0x0;
  QtPromise::QPromiseTimeoutException::QPromiseTimeoutException(local_90);
  QtPromise::QPromiseBase<int>::timeout<QtPromise::QPromiseTimeoutException>
            (&local_48,(milliseconds)&local_58,local_68);
  local_a0 = &p.super_QPromiseBase<int>.m_d;
  local_98 = &elapsed;
  handler.timer = (QElapsedTimer *)local_a0;
  handler.elapsed = (qint64 *)&local_48;
  QtPromise::QPromiseBase<int>::finally<tst_qpromise_timeout::rejectedStdChrono()::__1>
            ((QPromiseBase<int> *)local_38,handler);
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)&local_48);
  QtPromise::QPromiseTimeoutException::~QPromiseTimeoutException(local_90);
  QtPromise::QPromise<int>::~QPromise(&local_58);
  QString::QString(&local_d0);
  waitForError<int,QString>(&local_b8,(QPromise<int> *)local_38,&local_d0);
  QString::QString(&local_e8,"foo");
  bVar1 = QTest::qCompare(&local_b8,&local_e8,"waitForError(p, QString{})","QString{\"foo\"}",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_timeout.cpp"
                          ,0x92);
  QString::~QString(&local_e8);
  QString::~QString(&local_b8);
  QString::~QString(&local_d0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_ed[0] = QtPromise::QPromiseBase<int>::isRejected((QPromiseBase<int> *)local_38);
    local_ee = true;
    bVar1 = QTest::qCompare<bool,bool>
                      (local_ed,&local_ee,"p.isRejected()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_timeout.cpp"
                       ,0x93);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      bVar2 = QTest::qVerify((long)p.super_QPromiseBase<int>.m_d.d < 2000,"elapsed < 2000","",
                             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_timeout.cpp"
                             ,0x94);
      if ((bVar2 & 1) == 0) {
        local_ed[1] = true;
        local_ed[2] = false;
        local_ed[3] = false;
        local_ed[4] = false;
      }
      else {
        local_ed[1] = false;
        local_ed[2] = false;
        local_ed[3] = false;
        local_ed[4] = false;
      }
    }
    else {
      local_ed[1] = true;
      local_ed[2] = false;
      local_ed[3] = false;
      local_ed[4] = false;
    }
  }
  else {
    local_ed[1] = true;
    local_ed[2] = false;
    local_ed[3] = false;
    local_ed[4] = false;
  }
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)local_38);
  return;
}

Assistant:

void tst_qpromise_timeout::rejectedStdChrono()
{
    QElapsedTimer timer;
    qint64 elapsed = -1;

    timer.start();

    auto p = QtPromise::QPromise<int>{[](const QtPromise::QPromiseResolve<int>&,
                                         const QtPromise::QPromiseReject<int>& reject) {
                 QTimer::singleShot(1000, [=]() {
                     reject(QString{"foo"});
                 });
             }}.timeout(std::chrono::seconds{2})
                 .finally([&]() {
                     elapsed = timer.elapsed();
                 });

    QCOMPARE(waitForError(p, QString{}), QString{"foo"});
    QCOMPARE(p.isRejected(), true);
    QVERIFY(elapsed < 2000);
}